

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_loop.c
# Opt level: O0

void enc_loop_ssse3(uint8_t **s,size_t *slen,uint8_t **o,size_t *olen)

{
  ulong local_30;
  size_t rounds;
  size_t *olen_local;
  uint8_t **o_local;
  size_t *slen_local;
  uint8_t **s_local;
  
  if (0xf < *slen) {
    local_30 = (*slen - 4) / 0xc;
    *slen = *slen + local_30 * -0xc;
    *olen = local_30 * 0x10 + *olen;
    do {
      if (local_30 < 8) {
        if (local_30 < 4) {
          if (local_30 < 2) {
            enc_loop_ssse3_inner(s,o);
            return;
          }
          enc_loop_ssse3_inner(s,o);
          enc_loop_ssse3_inner(s,o);
          local_30 = local_30 - 2;
        }
        else {
          enc_loop_ssse3_inner(s,o);
          enc_loop_ssse3_inner(s,o);
          enc_loop_ssse3_inner(s,o);
          enc_loop_ssse3_inner(s,o);
          local_30 = local_30 - 4;
        }
      }
      else {
        enc_loop_ssse3_inner(s,o);
        enc_loop_ssse3_inner(s,o);
        enc_loop_ssse3_inner(s,o);
        enc_loop_ssse3_inner(s,o);
        enc_loop_ssse3_inner(s,o);
        enc_loop_ssse3_inner(s,o);
        enc_loop_ssse3_inner(s,o);
        enc_loop_ssse3_inner(s,o);
        local_30 = local_30 - 8;
      }
    } while (local_30 != 0);
  }
  return;
}

Assistant:

static inline void
enc_loop_ssse3 (const uint8_t **s, size_t *slen, uint8_t **o, size_t *olen)
{
	if (*slen < 16) {
		return;
	}

	// Process blocks of 12 bytes at a time. Because blocks are loaded 16
	// bytes at a time, ensure that there will be at least 4 remaining
	// bytes after the last round, so that the final read will not pass
	// beyond the bounds of the input buffer:
	size_t rounds = (*slen - 4) / 12;

	*slen -= rounds * 12;	// 12 bytes consumed per round
	*olen += rounds * 16;	// 16 bytes produced per round

	do {
		if (rounds >= 8) {
			enc_loop_ssse3_inner(s, o);
			enc_loop_ssse3_inner(s, o);
			enc_loop_ssse3_inner(s, o);
			enc_loop_ssse3_inner(s, o);
			enc_loop_ssse3_inner(s, o);
			enc_loop_ssse3_inner(s, o);
			enc_loop_ssse3_inner(s, o);
			enc_loop_ssse3_inner(s, o);
			rounds -= 8;
			continue;
		}
		if (rounds >= 4) {
			enc_loop_ssse3_inner(s, o);
			enc_loop_ssse3_inner(s, o);
			enc_loop_ssse3_inner(s, o);
			enc_loop_ssse3_inner(s, o);
			rounds -= 4;
			continue;
		}
		if (rounds >= 2) {
			enc_loop_ssse3_inner(s, o);
			enc_loop_ssse3_inner(s, o);
			rounds -= 2;
			continue;
		}
		enc_loop_ssse3_inner(s, o);
		break;

	} while (rounds > 0);
}